

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.h
# Opt level: O2

void __thiscall Argument::Argument(Argument *this,int argc,char **argv)

{
  string *__lhs;
  string *__lhs_00;
  string *this_00;
  string *__rhs;
  double dVar1;
  bool bVar2;
  int iVar3;
  unsigned_long_long uVar4;
  long lVar5;
  string *this_01;
  string *psVar6;
  float fVar7;
  string value;
  string local_308;
  string *local_2e8;
  string *local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string param;
  string postfix;
  
  this->_func = 2;
  this->_seedsize = 0x32;
  this->_samplesize = 1000;
  this->_probEdge = 0.1;
  this->_budget = 5000.0;
  this->_eps = 0.1;
  this->_feps = 0.1;
  this->_delta = -1.0;
  this->_percent = 0.99999;
  this->_budpercent = 0.0001;
  this->_normalpha = 0.2;
  this->_model = IC;
  this_01 = &this->_graphname;
  std::__cxx11::string::string((string *)this_01,"facebook",(allocator *)&postfix);
  __lhs = &this->_mode;
  std::__cxx11::string::string((string *)__lhs,"g",(allocator *)&postfix);
  local_2e0 = (string *)&this->_dir;
  std::__cxx11::string::string(local_2e0,"graphInfo",(allocator *)&postfix);
  local_2e8 = (string *)&this->_resultFolder;
  std::__cxx11::string::string(local_2e8,"result",(allocator *)&postfix);
  __lhs_00 = &this->_algName;
  std::__cxx11::string::string((string *)__lhs_00,"opim-b",(allocator *)&postfix);
  this_00 = &this->_probDist;
  std::__cxx11::string::string((string *)this_00,"load",(allocator *)&postfix);
  (this->_outFileName)._M_dataplus._M_p = (pointer)&(this->_outFileName).field_2;
  (this->_outFileName)._M_string_length = 0;
  (this->_outFileName).field_2._M_local_buf[0] = '\0';
  param._M_dataplus._M_p = (pointer)&param.field_2;
  param._M_string_length = 0;
  __rhs = &this->_outFileName;
  param.field_2._M_local_buf[0] = '\0';
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  for (lVar5 = 1; (lVar5 < argc && (*argv[lVar5] == '-')); lVar5 = lVar5 + 1) {
    std::__cxx11::string::string((string *)&local_308,argv[lVar5],(allocator *)&local_2b8);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&postfix,(string *)&local_308,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&local_308);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&postfix,(string *)&param,'=');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&postfix,(string *)&value,'=');
    iVar3 = std::__cxx11::string::compare((char *)&param);
    if (iVar3 == 0) {
      iVar3 = std::__cxx11::stoi(&value,(size_t *)0x0,10);
      this->_func = iVar3;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&param);
      if (iVar3 == 0) {
        iVar3 = std::__cxx11::stoi(&value,(size_t *)0x0,10);
        this->_seedsize = iVar3;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&param);
        if (iVar3 == 0) {
          uVar4 = std::__cxx11::stoull(&value,(size_t *)0x0,10);
          this->_samplesize = uVar4;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&param);
          if (iVar3 == 0) {
            fVar7 = std::__cxx11::stof(&value,(size_t *)0x0);
            this->_probEdge = fVar7;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&param);
            if (iVar3 == 0) {
              dVar1 = std::__cxx11::stod(&value,(size_t *)0x0);
              this->_eps = dVar1;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&param);
              if (iVar3 == 0) {
                dVar1 = std::__cxx11::stod(&value,(size_t *)0x0);
                this->_feps = dVar1;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&param);
                if (iVar3 == 0) {
                  dVar1 = std::__cxx11::stod(&value,(size_t *)0x0);
                  this->_delta = dVar1;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&param);
                  if (iVar3 == 0) {
                    dVar1 = std::__cxx11::stod(&value,(size_t *)0x0);
                    this->_budget = dVar1;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)&param);
                    if (iVar3 == 0) {
                      dVar1 = std::__cxx11::stod(&value,(size_t *)0x0);
                      this->_budpercent = dVar1;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)&param);
                      if (iVar3 == 0) {
                        dVar1 = std::__cxx11::stod(&value,(size_t *)0x0);
                        this->_normalpha = dVar1;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)&param);
                        if (iVar3 == 0) {
                          bVar2 = std::operator==(&value,"LT");
                          this->_model = (uint)bVar2;
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)&param);
                          psVar6 = (string *)this_01;
                          if (iVar3 != 0) {
                            iVar3 = std::__cxx11::string::compare((char *)&param);
                            psVar6 = (string *)__lhs;
                            if (iVar3 != 0) {
                              iVar3 = std::__cxx11::string::compare((char *)&param);
                              psVar6 = local_2e0;
                              if (iVar3 != 0) {
                                iVar3 = std::__cxx11::string::compare((char *)&param);
                                psVar6 = local_2e8;
                                if (iVar3 != 0) {
                                  iVar3 = std::__cxx11::string::compare((char *)&param);
                                  psVar6 = (string *)__lhs_00;
                                  if (iVar3 != 0) {
                                    iVar3 = std::__cxx11::string::compare((char *)&param);
                                    psVar6 = (string *)this_00;
                                    if (iVar3 != 0) goto LAB_0011308d;
                                  }
                                }
                              }
                            }
                          }
                          std::__cxx11::string::_M_assign(psVar6);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0011308d:
    std::__cxx11::stringstream::~stringstream((stringstream *)&postfix);
  }
  std::__cxx11::string::string((string *)&postfix,"_minBound",(allocator *)&local_308);
  bVar2 = std::operator==(__lhs,"0");
  if (bVar2) {
LAB_0011311a:
    std::__cxx11::string::assign((char *)&postfix);
  }
  else {
    bVar2 = std::operator==(__lhs,"vanilla");
    if (bVar2) goto LAB_0011311a;
    bVar2 = std::operator==(__lhs,"1");
    if (bVar2) goto LAB_0011311a;
    bVar2 = std::operator==(__lhs,"last");
    if (bVar2) goto LAB_0011311a;
  }
  bVar2 = std::operator==(__lhs_00,"opim-b");
  if (bVar2) {
LAB_00113258:
    std::__cxx11::string::string((string *)&local_1f8,(string *)this_01);
    std::operator+(&local_218,__lhs_00,&postfix);
    dVar1 = this->_budpercent;
    local_2c0 = this->_normalpha;
    local_2c8 = this->_percent;
    local_2d0 = this->_eps;
    local_2d8 = this->_feps;
    std::__cxx11::string::string((string *)&local_238,(string *)this_00);
    IOcontroller::get_out_file_name_budget
              (&local_308,&local_1f8,&local_218,dVar1,local_2c0,local_2c8,local_2d0,local_2d8,
               &local_238,this->_probEdge);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else {
    bVar2 = std::operator==(__lhs_00,"OPIM-B");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"opim-b-n");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"OPIM-B-N");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"opim-b-fe");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"OPIM-B-FE");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"opim-ba");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"OPIM-BA");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"opim-b-fa");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"OPIM-B-FA");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"opim-a");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"OPIM-A");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"opim-a-f");
    if (bVar2) goto LAB_00113258;
    bVar2 = std::operator==(__lhs_00,"OPIM-A-F");
    if (bVar2) goto LAB_00113258;
    std::__cxx11::string::string((string *)&local_258,(string *)this_01);
    std::operator+(&local_278,__lhs_00,&postfix);
    iVar3 = this->_seedsize;
    std::__cxx11::string::string((string *)&local_298,(string *)this_00);
    IOcontroller::get_out_file_name
              (&local_308,&local_258,&local_278,iVar3,&local_298,this->_probEdge);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
  }
  if (this->_model == LT) {
    std::operator+(&local_308,"LT_",__rhs);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
  }
  bVar2 = std::operator==(__lhs_00,"OPIM");
  if (!bVar2) {
    bVar2 = std::operator==(__lhs_00,"opim");
    if (!bVar2) goto LAB_00113428;
  }
  std::__cxx11::to_string(&local_2b8,this->_samplesize);
  std::operator+(&local_308,"_s",&local_2b8);
  std::__cxx11::string::append((string *)__rhs);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2b8);
LAB_00113428:
  std::__cxx11::string::~string((string *)&postfix);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&param);
  return;
}

Assistant:

Argument(int argc, char* argv[])
    {
        std::string param, value;
        for (int ind = 1; ind < argc; ind++)
        {
            if (argv[ind][0] != '-') {
                break;
            }
            std::stringstream sstr(argv[ind]);
            getline(sstr, param, '=');
            getline(sstr, value, '=');
            if (!param.compare("-func")) {
                _func = stoi(value);
            }
            else if (!param.compare("-seedsize")) {
                _seedsize = stoi(value);
            }
            else if (!param.compare("-samplesize")) {
                _samplesize = stoull(value);
            }
            else if (!param.compare("-pedge")) {
                _probEdge = stof(value);
            }
            else if (!param.compare("-eps")) {
                _eps = stod(value);
            }
            else if (!param.compare("-feps")) {
                _feps = stod(value);
            }
            else if (!param.compare("-delta")) {
                _delta = stod(value);
            }
            else if (!param.compare("-budget")) {
                _budget = stod(value);
            }
            else if (!param.compare("-budper")) {
                _budpercent = stod(value);
            }
            else if (!param.compare("-nalpha")) {
                _normalpha = stod(value);
            }
            else if (!param.compare("-model")) {
                _model = value == "LT" ? LT : IC;
            }
            else if (!param.compare("-gname")) {
                _graphname = value;
            }
            else if (!param.compare("-mode")) {
                _mode = value;
            }
            else if (!param.compare("-dir")) {
                _dir = value;
            }
            else if (!param.compare("-outpath")) {
                _resultFolder = value;
            }
            else if (!param.compare("-alg")) {
                _algName = value;
            }
            else if (!param.compare("-pdist")) {
                _probDist = value;
            }
        }
        std::string postfix = "_minBound"; // Default is to use the minimum upper bound among all the rounds
        if (_mode == "0" || _mode == "vanilla") {
            postfix = "_vanilla";
        }
        else if (_mode == "1" || _mode == "last") {
            postfix = "_lastBound";
        }
        if (_algName == "opim-b" || _algName == "OPIM-B" ||
            _algName == "opim-b-n" || _algName == "OPIM-B-N" ||
            _algName == "opim-b-fe" || _algName == "OPIM-B-FE" ||
            _algName == "opim-ba" || _algName == "OPIM-BA" ||
            _algName == "opim-b-fa" || _algName == "OPIM-B-FA" ||
            _algName == "opim-a" || _algName == "OPIM-A" ||
            _algName == "opim-a-f" || _algName == "OPIM-A-F") {
            _outFileName = TIO::get_out_file_name_budget(_graphname, _algName + postfix, _budpercent,
                    _normalpha, _percent, _eps, _feps, _probDist, _probEdge);
        }
        else {
            _outFileName = TIO::get_out_file_name(_graphname, _algName + postfix, _seedsize, _probDist, _probEdge);
        }
        if (_model == LT) {
            _outFileName = "LT_" + _outFileName;
        }
        if (_algName == "OPIM" || _algName == "opim") {
            _outFileName += "_s" + std::to_string(_samplesize);
        }
    }